

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteLoop<long,duckdb::timestamp_t,duckdb::UnaryLambdaWrapper,duckdb::timestamp_t(*)(long)>
               (long *ldata,timestamp_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  bool bVar1;
  idx_t row_idx;
  void *dataptr_00;
  timestamp_t tVar2;
  SelectionVector *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  long in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  idx_t in_stack_ffffffffffffff98;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffa8;
  timestamp_t in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  TemplatedValidityMask<unsigned_long> *pTVar3;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar1) {
    for (pTVar3 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar3 < in_RDX;
        pTVar3 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar3->validity_mask + 1)) {
      dataptr_00 = (void *)SelectionVector::get_index(in_RCX,(idx_t)pTVar3);
      tVar2 = UnaryLambdaWrapper::Operation<duckdb::timestamp_t(*)(long),long,duckdb::timestamp_t>
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0.value,(idx_t)pTVar3,
                         dataptr_00);
      *(int64_t *)(in_RSI + (long)pTVar3 * 8) = tVar2.value;
    }
  }
  else {
    for (pTVar3 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar3 < in_RDX;
        pTVar3 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar3->validity_mask + 1)) {
      row_idx = SelectionVector::get_index(in_RCX,(idx_t)pTVar3);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValidUnsafe(pTVar3,row_idx);
      if (bVar1) {
        in_stack_ffffffffffffffb0 =
             UnaryLambdaWrapper::Operation<duckdb::timestamp_t(*)(long),long,duckdb::timestamp_t>
                       (row_idx,in_stack_ffffffffffffffb0.value,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0);
        *(int64_t *)(in_RSI + (long)pTVar3 * 8) = in_stack_ffffffffffffffb0.value;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}